

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::BasicBufferBind::Run(BasicBufferBind *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  GLint expected;
  GLint expected_00;
  GLint expected_01;
  GLint expected_02;
  GLint index_2;
  uint index_00;
  long lVar4;
  GLint index_1;
  GLint index;
  GLuint GVar5;
  GLint bindings;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  GLint i;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92dc,&bindings);
  GVar5 = 0;
  glcts::anon_unknown_0::Output("MAX_ATOMIC_COUNTER_BUFFER_BINDINGS: %d\n");
  bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                    (&this->super_SACSubcaseBase,0,expected);
  while( true ) {
    if (bVar1 == false) {
      return -1;
    }
    if (bindings <= (int)GVar5) break;
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                      (&this->super_SACSubcaseBase,GVar5,0,0,0);
    GVar5 = GVar5 + 1;
  }
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->buffer_);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                    (&this->super_SACSubcaseBase,this->buffer_,expected_00);
  if (!bVar1) {
    return -1;
  }
  GVar5 = 0;
  do {
    if (bindings <= (int)GVar5) {
      glu::CallLogWrapper::glBufferData(this_00,0x92c0,1000,(void *)0x0,0x88ea);
      glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->buffer_);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,0,this->buffer_,0,1000);
      local_35 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                           (&this->super_SACSubcaseBase,this->buffer_,expected_01);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,bindings / 2,this->buffer_);
      local_36 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                           (&this->super_SACSubcaseBase,bindings / 2,this->buffer_,0,1000);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,bindings - 1,this->buffer_);
      local_37 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                           (&this->super_SACSubcaseBase,bindings - 1,this->buffer_,0,1000);
      glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
      glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,0,this->buffer_,8,0x20);
      local_38 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                           (&this->super_SACSubcaseBase,0,this->buffer_,8,0x20);
      local_39 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                           (&this->super_SACSubcaseBase,this->buffer_,expected_02);
      glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,bindings / 2,this->buffer_,0x200,100);
      bVar2 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,bindings / 2,this->buffer_,0x200,100);
      glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,bindings - 1,this->buffer_,0xc,0x80);
      bVar3 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,bindings - 1,this->buffer_,0xc,0x80);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->buffer_);
      this->buffer_ = 0;
      glu::CallLogWrapper::glGetIntegerv(this_00,0x92c1,&i);
      if (i == 0) {
        lVar4 = (ulong)((bVar2 && bVar3) &
                       bVar1 & local_35 & local_37 & local_38 & local_39 & local_36) - 1;
      }
      else {
        glcts::anon_unknown_0::Output
                  ("Generic binding point should be 0 after deleting bound buffer object.\n");
        lVar4 = -1;
      }
      for (index_00 = 0; (int)index_00 < bindings; index_00 = index_00 + 1) {
        glu::CallLogWrapper::glGetIntegeri_v(this_00,0x92c1,index_00,&i);
        if (i != 0) {
          glcts::anon_unknown_0::Output
                    ("Binding point %u should be 0 after deleting bound buffer object.\n",
                     (ulong)index_00);
          lVar4 = -1;
        }
      }
      return lVar4;
    }
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                      (&this->super_SACSubcaseBase,GVar5,0,0,0);
    GVar5 = GVar5 + 1;
  } while (bVar1);
  return -1;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &bindings);
		Output("MAX_ATOMIC_COUNTER_BUFFER_BINDINGS: %d\n", bindings);

		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, 0))
			return ERROR;
		for (GLint index = 0; index < bindings; ++index)
		{
			if (!CheckBufferBindingState(static_cast<GLuint>(index), 0, 0, 0))
				return ERROR;
		}

		glGenBuffers(1, &buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);

		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLint>(buffer_)))
			return ERROR;
		for (GLint index = 0; index < bindings; ++index)
		{
			if (!CheckBufferBindingState(static_cast<GLuint>(index), 0, 0, 0))
				return ERROR;
		}

		long res = NO_ERROR;

		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 1000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, buffer_);
		if (!CheckBufferBindingState(0, static_cast<GLint>(buffer_), 0, 1000))
			res = ERROR;
		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLint>(buffer_)))
			res = ERROR;

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings / 2), buffer_);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings / 2), static_cast<GLint>(buffer_), 0, 1000))
			res = ERROR;

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings - 1), buffer_);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings - 1), static_cast<GLint>(buffer_), 0, 1000))
			res = ERROR;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, buffer_, 8, 32);
		if (!CheckBufferBindingState(0, static_cast<GLint>(buffer_), 8, 32))
			res = ERROR;
		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLint>(buffer_)))
			res = ERROR;

		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings / 2), buffer_, 512, 100);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings / 2), static_cast<GLint>(buffer_), 512, 100))
			res = ERROR;

		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings - 1), buffer_, 12, 128);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings - 1), static_cast<GLint>(buffer_), 12, 128))
			res = ERROR;

		glDeleteBuffers(1, &buffer_);
		buffer_ = 0;

		GLint i;
		glGetIntegerv(GL_ATOMIC_COUNTER_BUFFER_BINDING, &i);
		if (i != 0)
		{
			Output("Generic binding point should be 0 after deleting bound buffer object.\n");
			res = ERROR;
		}
		for (GLint index = 0; index < bindings; ++index)
		{
			glGetIntegeri_v(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLuint>(index), &i);
			if (i != 0)
			{
				Output("Binding point %u should be 0 after deleting bound buffer object.\n", index);
				res = ERROR;
			}
		}

		return res;
	}